

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_copy_rect8_16bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  ulong uVar3;
  ulong uVar4;
  uint16_t *puVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    pauVar2 = (undefined1 (*) [16])src;
    puVar5 = dst;
    for (lVar6 = 0; lVar6 < (int)(width & 0xfffffff8); lVar6 = lVar6 + 8) {
      auVar1 = vlddqu_avx(*pauVar2);
      *(undefined1 (*) [16])(dst + lVar6) = auVar1;
      pauVar2 = pauVar2 + 1;
      puVar5 = puVar5 + 8;
    }
    for (lVar7 = 0; lVar6 + lVar7 < (long)width; lVar7 = lVar7 + 1) {
      *puVar5 = *(uint16_t *)(*pauVar2 + lVar7 * 2);
      puVar5 = puVar5 + 1;
    }
    dst = dst + dstride;
    src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 2);
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}